

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O1

void __thiscall ApplicationContext::CreateCSP(ApplicationContext *this)

{
  char *src;
  size_t len;
  CSP *pCVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f8;
  code *local_e8;
  code *pcStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  src = csp_ac_src;
  len = strlen(csp_ac_src);
  lVar2 = 0;
  pCVar1 = csp_parse((CSP *)0x0,src,len);
  this->csp = pCVar1;
  std::__shared_ptr<ApplicationContextBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<ApplicationContextBase,void>
            ((__shared_ptr<ApplicationContextBase,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (__weak_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_ApplicationContextBase).
              super_enable_shared_from_this<ApplicationContextBase>);
  if (local_58 != 0) {
    lVar2 = __dynamic_cast(local_58,&ApplicationContextBase::typeinfo,&typeinfo,0);
  }
  if (lVar2 == 0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar2 = 0;
  }
  else {
    this_00 = local_50;
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_50->_M_use_count = local_50->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_50->_M_use_count = local_50->_M_use_count + 1;
      }
    }
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x10);
  *(long *)local_78._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 8) = this_00;
  pcStack_60 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:79:44)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:79:44)>
             ::_M_manager;
  csp_bind_lambda(pCVar1,"push_value",(function<void_(int)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x10);
  *(long *)local_98._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_98._M_unused._0_8_ + 8) = this_00;
  pcStack_80 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:127:43)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:127:43)>
             ::_M_manager;
  csp_bind_lambda(pCVar1,"pop_value",(function<void_(int)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_b8._M_unused._M_object = operator_new(0x10);
  *(long *)local_b8._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b8._M_unused._0_8_ + 8) = this_00;
  pcStack_a0 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:151:37)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:151:37)>
             ::_M_manager;
  csp_bind_lambda(pCVar1,"add",(function<void_(int)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_d8._M_unused._M_object = operator_new(0x10);
  *(long *)local_d8._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_d8._M_unused._0_8_ + 8) = this_00;
  pcStack_c0 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:187:42)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:187:42)>
             ::_M_manager;
  csp_bind_lambda(pCVar1,"subtract",(function<void_(int)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_e8 = (code *)0x0;
  pcStack_e0 = (code *)0x0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_f8._M_unused._M_object = operator_new(0x10);
  *(long *)local_f8._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_f8._M_unused._0_8_ + 8) = this_00;
  pcStack_e0 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:215:42)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:215:42)>
             ::_M_manager;
  csp_bind_lambda(pCVar1,"multiply",(function<void_(int)> *)&local_f8);
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  pCVar1 = this->csp;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x10);
  *(long *)local_118._M_unused._0_8_ = lVar2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_118._M_unused._0_8_ + 8) = this_00;
  pcStack_100 = std::
                _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:240:40)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:240:40)>
              ::_M_manager;
  csp_bind_lambda(pCVar1,"divide",(function<void_(int)> *)&local_118);
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  local_48._8_8_ = 0;
  pcStack_30 = std::
               _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:271:42)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/meshula[P]gusteau/src/chapter3.cpp:271:42)>
             ::_M_manager;
  local_48._M_unused._M_object = this;
  csp_bind_lambda(this->csp,"join_now",(function<void_(int)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void CreateCSP()
    {
        csp = csp_parse(nullptr, csp_ac_src, strlen(csp_ac_src));

        /// The execution of actions becomes complicated by the introduction of
        /// undo. The first consideration is that we mustn't keep references to
        /// the application context in all the history's lambdas
        std::shared_ptr<ApplicationContext> app = std::dynamic_pointer_cast<ApplicationContext>(this->shared_from_this());

        csp_bind_lambda(csp, "push_value", [app](int id)
        {
            if (id && app)
            {
                ///>
                /// The append line event comes with a floating point value 
                ///<C++
                TypedData* d = blackboard_get(app->blackboard, id);
                auto td = dynamic_cast<Data<float>*>(d);
                if (td)
                {
///>
/// The operation modified the ApplicationContext, so record the operation
/// in the journal. The journal records both the action that was taken, 
/// and the reverse operation. The inverse of pushing a value on the stack is to pop it.
/// Previously, the journal was a simple record of an action.  Now,
/// we are going to explore more complex actions, with more complex undo
/// behavior. So a more sophisticated journal is required. Since the application
/// is multi-threaded, many actions could occur concurrently. In the case of
/// an action with a simple undo, that's no big deal, since one action is paired
/// with one undo action. In a moment though, we will see an undo action that
/// requires multiple steps that have to go together. We introduce therefore
/// a Journal::Transaction that records a single atomic history/undo pair.
///<C++
                    Journal::Transaction transaction 
                    {  "push_value", 
                        [app, td]() 
                        {
                            app->value_stack.push_back(td->value());
                        },
                        [app]() 
                        { 
                            app->value_stack.pop_back(); 
                        }
                    };
                    transaction.action();
                    app->journal.commit(std::move(transaction));
                }
                else
                {
                    ///>
                    /// The data from the blackboard is not reference counted
                    /// so it must be deleted here.
                    ///<C++
                    delete d;
                }
            }
        });
        csp_bind_lambda(csp, "pop_value", [app](int)
        {
            if (app->value_stack.size())
            {
                // remember the value that was at the back of the value stack.
                float value = *app->value_stack.rbegin();

                /// The inverse of popping a value is to push it again.
                Journal::Transaction transaction
                {
                    "pop_value",
                    [value, app]()
                    {
                        app->value_stack.pop_back();
                    },
                    [value, app]()
                    {
                        app->value_stack.push_back(value);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "add", [app](int)
        {
            ///>
            /// This application is very simple, and doesn't report problems
            /// such as not enough values on the stack. A real application would.
            ///<C++
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                /// the history needs only record that an add occurred.
                /// The undo must remove the result, and push the original values.
                /// This is where the transactional nature of the journal comes
                /// into play.
                Journal::Transaction transaction
                {
                    "add",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 + value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "subtract", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "subtract",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 - value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        csp_bind_lambda(csp, "multiply", [app](int)
        {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "multiply",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 * value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
        });
        csp_bind_lambda(csp, "divide", [app](int)
        {
            if (app->value_stack.size() >= 2)
            {
                auto it = app->value_stack.rbegin();
                float value2 = *it++;
                float value1 = *it++;

                Journal::Transaction transaction
                {
                    "divide",
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1 / value2);
                    },
                    [app, value1, value2]() 
                    {
                        app->value_stack.pop_back();
                        app->value_stack.emplace_back(value1);
                        app->value_stack.emplace_back(value2);
                    }
                };
                transaction.action();
                app->journal.commit(std::move(transaction));
            }
        });
        ///>
        /// The join_now action is here, bound by name to the csp QUIT process.
        ///<C++
        csp_bind_lambda(csp, "join_now", [this](int) { join_now = true; });
    }